

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O3

void __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
::unbind_agent(dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>
               *this,agent_ref_t *agent)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  agent_t *this_00;
  int iVar3;
  _Base_ptr p_Var4;
  string *__k;
  iterator __position;
  const_iterator __position_00;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar3 == 0) {
    p_Var4 = (this->m_agents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var4 != (_Base_ptr)0x0) {
      this_00 = agent->m_obj;
      p_Var2 = &(this->m_agents)._M_t._M_impl.super__Rb_tree_header;
      __position_00._M_node = &p_Var2->_M_header;
      do {
        if (*(agent_t **)(p_Var4 + 1) >= this_00) {
          __position_00._M_node = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(agent_t **)(p_Var4 + 1) < this_00];
      } while (p_Var4 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)__position_00._M_node != p_Var2) &&
         (*(agent_t **)(__position_00._M_node + 1) <= this_00)) {
        if (__position_00._M_node[1]._M_left == (_Base_ptr)0x0) {
          __k = agent_t::so_coop_name_abi_cxx11_(this_00);
          __position = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
                       ::find(&(this->m_cooperations)._M_t,__k);
          if ((_Rb_tree_header *)__position._M_node !=
              &(this->m_cooperations)._M_t._M_impl.super__Rb_tree_header) {
            pp_Var1 = &__position._M_node[2]._M_parent;
            *pp_Var1 = (_Base_ptr)((long)&(*pp_Var1)[-1]._M_right + 7);
            if (*pp_Var1 == (_Base_ptr)0x0) {
              impl::agent_queue_t::wait_for_emptyness(*(agent_queue_t **)(__position._M_node + 2));
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
              ::_M_erase_aux(&(this->m_cooperations)._M_t,(const_iterator)__position._M_node);
            }
          }
        }
        else {
          impl::agent_queue_t::wait_for_emptyness
                    ((agent_queue_t *)__position_00._M_node[1]._M_parent);
        }
        std::
        _Rb_tree<so_5::agent_t_*,_std::pair<so_5::agent_t_*const,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>,_std::_Select1st<std::pair<so_5::agent_t_*const,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>_>,_std::less<so_5::agent_t_*>,_std::allocator<std::pair<so_5::agent_t_*const,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::thread_pool::impl::agent_queue_t>,_so_5::disp::thread_pool::impl::agent_queue_t,_so_5::disp::thread_pool::bind_params_t,_so_5::disp::thread_pool::impl::adaptation_t>::agent_data_t>_>_>
        ::_M_erase_aux(&(this->m_agents)._M_t,__position_00);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

virtual void
		unbind_agent( agent_ref_t agent ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				auto it = m_agents.find( agent.get() );
				if( it != m_agents.end() )
					{
						if( it->second.cooperation_fifo() )
							{
								auto it_coop = m_cooperations.find(
										agent->so_coop_name() );
								if( it_coop != m_cooperations.end() &&
										0 == --(it_coop->second.m_agents) )
									{
										// agent_queue object can be destroyed
										// only when it is empty.
										ADAPTATIONS::wait_for_queue_emptyness(
												*(it_coop->second.m_queue) );

										m_cooperations.erase( it_coop );
									}
							}
						else
							// agent_queue object can be destroyed
							// only when it is empty.
							ADAPTATIONS::wait_for_queue_emptyness(
									*(it->second.m_queue) );

						m_agents.erase( it );
					}
			}